

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O0

int __thiscall
deqp::gls::BufferTestUtil::VertexArrayVerifier::verify
          (VertexArrayVerifier *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  pointer *this_00;
  size_t *this_01;
  RenderContext *context;
  TestLog *log;
  int y;
  bool bVar1;
  int iVar2;
  int gridSizeX;
  int iVar3;
  int rowLength;
  undefined4 extraout_var;
  PixelFormat *this_03;
  size_type sVar4;
  reference data;
  reference data_00;
  char *imageSetDesc_00;
  undefined8 extraout_RAX;
  int iVar5;
  int iVar6;
  int local_274;
  deUint32 local_24c;
  int local_244;
  int local_1f4;
  PixelBufferAccess local_1f0;
  int local_1c4;
  string local_1c0;
  int local_19c;
  string local_198;
  allocator<char> local_171;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_110 [8];
  string imageSetDesc;
  int numRows;
  int numCols;
  int numQuads;
  int curOffset;
  int numBytesToVerify;
  undefined1 local_d0 [3];
  bool isLeftoverBatch;
  int numRemaining;
  Surface reference;
  undefined1 local_a8 [8];
  Surface rendered;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> positions;
  RGBA local_58;
  RGBA RStack_54;
  bool isOk;
  RGBA local_50;
  deUint32 local_4c;
  RGBA threshold;
  deUint32 program;
  int numVerified;
  int maxQuadsPerBatch;
  int maxQuadsY;
  int maxQuadsX;
  int numBytesInQuad;
  int numBytesInVtx;
  RenderTarget *renderTarget;
  int numBytes_local;
  int offset_local;
  deUint8 *refPtr_local;
  deUint32 buffer_local;
  VertexArrayVerifier *this_local;
  RenderTarget *this_02;
  
  iVar5 = (int)siglen;
  iVar6 = (int)tbs;
  iVar2 = (*((this->super_BufferVerifierBase).m_renderCtx)->_vptr_RenderContext[4])();
  this_02 = (RenderTarget *)CONCAT44(extraout_var,iVar2);
  iVar2 = tcu::RenderTarget::getWidth(this_02);
  if (iVar2 < 0) {
    iVar2 = iVar2 + 7;
  }
  gridSizeX = de::min<int>(0x80,iVar2 >> 3);
  iVar2 = tcu::RenderTarget::getHeight(this_02);
  if (iVar2 < 0) {
    iVar2 = iVar2 + 7;
  }
  iVar2 = de::min<int>(0x80,iVar2 >> 3);
  threshold.m_value = 0;
  local_4c = glu::ShaderProgram::getProgram(this->m_program);
  this_03 = tcu::RenderTarget::getPixelFormat(this_02);
  RStack_54 = tcu::PixelFormat::getColorThreshold(this_03);
  tcu::RGBA::RGBA(&local_58,3,3,3,3);
  local_50 = tcu::operator+(&stack0xffffffffffffffac,&local_58);
  positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&rendered.m_pixels.m_cap);
  tcu::Surface::Surface((Surface *)local_a8);
  tcu::Surface::Surface((Surface *)local_d0);
  computePositions((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                   &indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,gridSizeX,iVar2);
  computeIndices((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&rendered.m_pixels.m_cap
                 ,gridSizeX,iVar2);
  glu::CallLogWrapper::glBindBuffer(&(this->super_BufferVerifierBase).super_CallLogWrapper,0x88eb,0)
  ;
  glu::CallLogWrapper::glViewport
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,0,0,gridSizeX << 3,iVar2 << 3);
  glu::CallLogWrapper::glClearColor
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,0.0,0.0,0.0,1.0);
  glu::CallLogWrapper::glUseProgram(&(this->super_BufferVerifierBase).super_CallLogWrapper,local_4c)
  ;
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,this->m_vao);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,0x8892,this->m_positionBuf);
  this_00 = &indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  sVar4 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                    ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                     this_00);
  data = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                   ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                    this_00,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,0x8892,sVar4 << 3,data,0x88e4);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,this->m_posLoc);
  glu::CallLogWrapper::glVertexAttribPointer
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,this->m_posLoc,2,0x1406,'\0',0,
             (void *)0x0);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,0x8893,this->m_indexBuf);
  this_01 = &rendered.m_pixels.m_cap;
  sVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)this_01);
  data_00 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)this_01,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,0x8893,sVar4 * 2,data_00,0x88e4)
  ;
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,this->m_byteVecLoc);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,0x8892,(GLuint)ctx);
  do {
    if (iVar6 <= (int)threshold.m_value) break;
    iVar3 = iVar6 - threshold.m_value;
    if (0xb < iVar3) {
      local_274 = de::min<int>(gridSizeX * iVar2 * 0xc,
                               (((uint)(iVar3 / 6 + (iVar3 >> 0x1f)) >> 1) - (iVar3 >> 0x1f)) * 0xc)
      ;
      local_24c = threshold.m_value;
    }
    else {
      local_244 = 0xc;
      local_24c = iVar6 - 0xc;
      local_274 = local_244;
    }
    y = local_274 / 0xc;
    rowLength = de::min<int>(gridSizeX,y);
    imageSetDesc.field_2._12_4_ = (y / gridSizeX + 1) - (uint)(y % gridSizeX == 0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"Bytes ",&local_171);
    local_19c = iVar5 + local_24c;
    de::toString<int>(&local_198,&local_19c);
    std::operator+(&local_150,&local_170,&local_198);
    std::operator+(&local_130,&local_150," to ");
    local_1c4 = local_274 + -1 + iVar5 + local_24c;
    de::toString<int>(&local_1c0,&local_1c4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                   &local_130,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator(&local_171);
    glu::CallLogWrapper::glClear(&(this->super_BufferVerifierBase).super_CallLogWrapper,0x4000);
    glu::CallLogWrapper::glVertexAttribPointer
              (&(this->super_BufferVerifierBase).super_CallLogWrapper,this->m_byteVecLoc,3,0x1401,
               '\x01',0,(void *)(long)(int)(iVar5 + local_24c));
    glu::CallLogWrapper::glDrawElements
              (&(this->super_BufferVerifierBase).super_CallLogWrapper,4,y * 6,0x1403,(void *)0x0);
    renderQuadGridReference
              ((Surface *)local_d0,y,rowLength,sig + (long)(int)local_24c + (long)iVar5);
    tcu::Surface::setSize((Surface *)local_a8,rowLength << 3,imageSetDesc.field_2._12_4_ << 3);
    context = (this->super_BufferVerifierBase).m_renderCtx;
    tcu::Surface::getAccess(&local_1f0,(Surface *)local_a8);
    glu::readPixels(context,0,0,&local_1f0);
    log = (this->super_BufferVerifierBase).m_log;
    imageSetDesc_00 = (char *)std::__cxx11::string::c_str();
    bVar1 = tcu::pixelThresholdCompare
                      (log,"RenderResult",imageSetDesc_00,(Surface *)local_d0,(Surface *)local_a8,
                       &local_50,COMPARE_LOG_RESULT);
    if (bVar1) {
      if (0xb >= iVar3) {
        local_274 = iVar3;
      }
      threshold.m_value = local_274 + threshold.m_value;
      local_1f4 = 0;
    }
    else {
      positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      local_1f4 = 3;
    }
    std::__cxx11::string::~string((string *)local_110);
  } while (local_1f4 == 0);
  glu::CallLogWrapper::glBindVertexArray(&(this->super_BufferVerifierBase).super_CallLogWrapper,0);
  tcu::Surface::~Surface((Surface *)local_d0);
  tcu::Surface::~Surface((Surface *)local_a8);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&rendered.m_pixels.m_cap);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),
                       positions.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_);
}

Assistant:

bool VertexArrayVerifier::verify (deUint32 buffer, const deUint8* refPtr, int offset, int numBytes)
{
	const tcu::RenderTarget&	renderTarget		= m_renderCtx.getRenderTarget();
	const int					numBytesInVtx		= 3;
	const int					numBytesInQuad		= numBytesInVtx*4;
	int							maxQuadsX			= de::min(128, renderTarget.getWidth()	/ VERIFY_QUAD_SIZE);
	int							maxQuadsY			= de::min(128, renderTarget.getHeight()	/ VERIFY_QUAD_SIZE);
	int							maxQuadsPerBatch	= maxQuadsX*maxQuadsY;
	int							numVerified			= 0;
	deUint32					program				= m_program->getProgram();
	tcu::RGBA					threshold			= renderTarget.getPixelFormat().getColorThreshold() + tcu::RGBA(3,3,3,3);
	bool						isOk				= true;

	vector<tcu::Vec2>			positions;
	vector<deUint16>			indices;

	tcu::Surface				rendered;
	tcu::Surface				reference;

	DE_ASSERT(numBytes >= numBytesInQuad); // Can't render full quad with smaller buffers.

	computePositions(positions, maxQuadsX, maxQuadsY);
	computeIndices(indices, maxQuadsX, maxQuadsY);

	// Reset buffer bindings.
	glBindBuffer				(GL_PIXEL_PACK_BUFFER, 0);

	// Setup rendering state.
	glViewport					(0, 0, maxQuadsX*VERIFY_QUAD_SIZE, maxQuadsY*VERIFY_QUAD_SIZE);
	glClearColor				(0.0f, 0.0f, 0.0f, 1.0f);
	glUseProgram				(program);
	glBindVertexArray			(m_vao);

	// Upload positions
	glBindBuffer				(GL_ARRAY_BUFFER, m_positionBuf);
	glBufferData				(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(positions.size()*sizeof(positions[0])), &positions[0], GL_STATIC_DRAW);
	glEnableVertexAttribArray	(m_posLoc);
	glVertexAttribPointer		(m_posLoc, 2, GL_FLOAT, GL_FALSE, 0, DE_NULL);

	// Upload indices
	glBindBuffer				(GL_ELEMENT_ARRAY_BUFFER, m_indexBuf);
	glBufferData				(GL_ELEMENT_ARRAY_BUFFER, (glw::GLsizeiptr)(indices.size()*sizeof(indices[0])), &indices[0], GL_STATIC_DRAW);

	glEnableVertexAttribArray	(m_byteVecLoc);
	glBindBuffer				(GL_ARRAY_BUFFER, buffer);

	while (numVerified < numBytes)
	{
		int		numRemaining		= numBytes-numVerified;
		bool	isLeftoverBatch		= numRemaining < numBytesInQuad;
		int		numBytesToVerify	= isLeftoverBatch ? numBytesInQuad				: de::min(maxQuadsPerBatch*numBytesInQuad, numRemaining - numRemaining%numBytesInQuad);
		int		curOffset			= isLeftoverBatch ? (numBytes-numBytesInQuad)	: numVerified;
		int		numQuads			= numBytesToVerify/numBytesInQuad;
		int		numCols				= de::min(maxQuadsX, numQuads);
		int		numRows				= numQuads/maxQuadsX + (numQuads%maxQuadsX != 0 ? 1 : 0);
		string	imageSetDesc		= string("Bytes ") + de::toString(offset+curOffset) + " to " + de::toString(offset+curOffset+numBytesToVerify-1);

		DE_ASSERT(numBytesToVerify > 0 && numBytesToVerify%numBytesInQuad == 0);
		DE_ASSERT(de::inBounds(curOffset, 0, numBytes));
		DE_ASSERT(de::inRange(curOffset+numBytesToVerify, curOffset, numBytes));

		// Render batch.
		glClear					(GL_COLOR_BUFFER_BIT);
		glVertexAttribPointer	(m_byteVecLoc, 3, GL_UNSIGNED_BYTE, GL_TRUE, 0, (const glw::GLvoid*)(deUintptr)(offset + curOffset));
		glDrawElements			(GL_TRIANGLES, numQuads*6, GL_UNSIGNED_SHORT, DE_NULL);

		renderQuadGridReference(reference,  numQuads, numCols, refPtr + offset + curOffset);

		rendered.setSize(numCols*VERIFY_QUAD_SIZE, numRows*VERIFY_QUAD_SIZE);
		glu::readPixels(m_renderCtx, 0, 0, rendered.getAccess());

		if (!tcu::pixelThresholdCompare(m_log, "RenderResult", imageSetDesc.c_str(), reference, rendered, threshold, tcu::COMPARE_LOG_RESULT))
		{
			isOk = false;
			break;
		}

		numVerified += isLeftoverBatch ? numRemaining : numBytesToVerify;
	}

	glBindVertexArray(0);

	return isOk;
}